

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  iterator pvVar1;
  const_iterator pvVar2;
  iterator it;
  int default_val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  pvVar1 = LowerBound(&this->Data,key);
  pvVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  this_local._4_4_ = default_val;
  if ((pvVar1 != pvVar2) && (pvVar1->key == key)) {
    this_local._4_4_ = (pvVar1->field_1).val_i;
  }
  return this_local._4_4_;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImVector<Pair>::iterator it = LowerBound(const_cast<ImVector<ImGuiStorage::Pair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}